

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_4.cpp
# Opt level: O1

void __thiscall Date::Date(Date *this,int y,Month m,int d)

{
  bool bVar1;
  long *plVar2;
  undefined8 extraout_RAX;
  size_type *psVar3;
  stringstream ss;
  string local_1d8;
  long *local_1b8 [2];
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  this->y = y;
  this->m = m;
  this->d = d;
  bVar1 = is_valid(this);
  if (bVar1) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,this);
  std::__cxx11::stringbuf::str();
  plVar2 = (long *)std::__cxx11::string::append((char *)local_1b8);
  local_1d8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_1d8._M_dataplus._M_p == psVar3) {
    local_1d8.field_2._M_allocated_capacity = *psVar3;
    local_1d8.field_2._8_8_ = plVar2[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar3;
  }
  local_1d8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  error(&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Date::Date(int y, Month m, int d) : y{ y }, m{ m }, d{ d } 
{
	if (!is_valid(*this))
	{
		std::stringstream ss;
		ss << *this;
		error(ss.str() + " is not a valid date");
	}
}